

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O1

void __thiscall DMessageBoxMenu::Drawer(DMessageBoxMenu *this)

{
  int iVar1;
  EColorRange EVar2;
  FFont *pFVar3;
  DFrameBuffer *pDVar4;
  FBrokenLines *pFVar5;
  EColorRange *pEVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  iVar1 = SmallFont->FontHeight;
  pFVar5 = this->mMessage;
  if (pFVar5 == (FBrokenLines *)0x0) {
    iVar9 = 100;
  }
  else {
    if (pFVar5->Width < 0) {
      iVar9 = 100;
    }
    else {
      iVar9 = 100;
      do {
        pFVar5 = pFVar5 + 1;
        iVar9 = iVar9 - iVar1 / 2;
      } while (-1 < pFVar5->Width);
    }
    pFVar5 = this->mMessage;
    uVar8 = pFVar5->Width;
    if (-1 < (int)uVar8) {
      lVar10 = 0x10;
      do {
        DCanvas::DrawText((DCanvas *)screen,SmallFont,0xb,0xa0 - (uVar8 >> 1),iVar9,
                          (pFVar5->Text).Chars,0x40001390,1,0);
        iVar9 = iVar9 + iVar1;
        uVar8 = *(uint *)((long)&this->mMessage->Width + lVar10);
        pFVar5 = (FBrokenLines *)((long)&this->mMessage->Width + lVar10);
        lVar10 = lVar10 + 0x10;
      } while (-1 < (int)uVar8);
    }
  }
  if (this->mMessageMode == 0) {
    iVar9 = iVar9 + iVar1;
    this->mMouseY = iVar9;
    pDVar4 = screen;
    pFVar3 = SmallFont;
    pEVar6 = &OptionSettings.mFontColor;
    if (this->messageSelection == 0) {
      pEVar6 = &OptionSettings.mFontColorSelection;
    }
    EVar2 = *pEVar6;
    pcVar7 = FStringTable::operator[](&GStrings,"TXT_YES");
    DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,EVar2,0xa0,iVar9,pcVar7,0x40001390,1,0);
    pDVar4 = screen;
    pFVar3 = SmallFont;
    pEVar6 = &OptionSettings.mFontColor;
    if (this->messageSelection == 1) {
      pEVar6 = &OptionSettings.mFontColorSelection;
    }
    EVar2 = *pEVar6;
    pcVar7 = FStringTable::operator[](&GStrings,"TXT_NO");
    DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,EVar2,0xa0,iVar1 + iVar9 + 1,pcVar7,0x40001390,1,0);
    if ((-1 < this->messageSelection) && (DMenu::MenuTime % 8 < 6)) {
      DCanvas::DrawText((DCanvas *)screen,ConFont,OptionSettings.mFontColorSelection,
                        (screen->super_DSimpleCanvas).super_DCanvas.Width / 2 + CleanXfac * -10,
                        (screen->super_DSimpleCanvas).super_DCanvas.Height / 2 +
                        (this->messageSelection * (iVar1 + 1) + iVar1 / 2 + iVar9 + -0x69) *
                        CleanYfac,"\r",0x400013b8,(ulong)(uint)(CleanXfac << 3),0x400013b9,
                        (ulong)(uint)(CleanYfac << 3),0);
    }
  }
  return;
}

Assistant:

void DMessageBoxMenu::Drawer ()
{
	int i, y;
	PalEntry fade = 0;

	int fontheight = SmallFont->GetHeight();
	//V_SetBorderNeedRefresh();
	//ST_SetNeedRefresh();

	y = 100;

	if (mMessage != NULL)
	{
		for (i = 0; mMessage[i].Width >= 0; i++)
			y -= SmallFont->GetHeight () / 2;

		for (i = 0; mMessage[i].Width >= 0; i++)
		{
			screen->DrawText (SmallFont, CR_UNTRANSLATED, 160 - mMessage[i].Width/2, y, mMessage[i].Text,
				DTA_Clean, true, TAG_DONE);
			y += fontheight;
		}
	}

	if (mMessageMode == 0)
	{
		y += fontheight;
		mMouseY = y;
		screen->DrawText(SmallFont, 
			messageSelection == 0? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, 
			160, y, GStrings["TXT_YES"], DTA_Clean, true, TAG_DONE);
		screen->DrawText(SmallFont, 
			messageSelection == 1? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, 
			160, y + fontheight + 1, GStrings["TXT_NO"], DTA_Clean, true, TAG_DONE);

		if (messageSelection >= 0)
		{
			if ((DMenu::MenuTime%8) < 6)
			{
				screen->DrawText(ConFont, OptionSettings.mFontColorSelection,
					(150 - 160) * CleanXfac + screen->GetWidth() / 2,
					(y + (fontheight + 1) * messageSelection - 100 + fontheight/2 - 5) * CleanYfac + screen->GetHeight() / 2,
					"\xd",
					DTA_CellX, 8 * CleanXfac,
					DTA_CellY, 8 * CleanYfac,
					TAG_DONE);
			}
		}
	}
}